

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

uint CountArguments(ParseNode *pnode,BOOL *pSideEffect)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  ParseNodeBin *pPVar4;
  undefined4 *puVar5;
  uint uVar6;
  
  if (pSideEffect != (BOOL *)0x0) {
    *pSideEffect = 0;
  }
  if (pnode == (ParseNode *)0x0) {
    uVar6 = 1;
  }
  else {
    uVar6 = 2;
    while( true ) {
      if (pnode->nop != 0x50) break;
      if (pSideEffect != (BOOL *)0x0) {
        pPVar4 = ParseNode::AsParseNodeBin(pnode);
        uVar3 = ParseNode::Grfnop((uint)pPVar4->pnode1->nop);
        if ((uVar3 & 2) == 0) {
          *pSideEffect = 1;
        }
      }
      pPVar4 = ParseNode::AsParseNodeBin(pnode);
      pnode = pPVar4->pnode2;
      uVar6 = uVar6 + 1;
    }
    if (pSideEffect != (BOOL *)0x0) {
      uVar3 = ParseNode::Grfnop((uint)pnode->nop);
      if ((uVar3 & 2) == 0) {
        *pSideEffect = 1;
      }
    }
    if (0xfffe < uVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x1773,"(argCount < Js::Constants::UShortMaxValue)",
                         "Number of allowed arguments are already capped at parser level");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  return uVar6;
}

Assistant:

unsigned int CountArguments(ParseNode *pnode, BOOL *pSideEffect = nullptr)
{
    // If the caller passed us a pSideEffect, it wants to know whether there are potential
    // side-effects in the argument list. We need to know this so that the call target
    // operands can be preserved if necessary.
    // For now, treat any non-leaf op as a potential side-effect. This causes no detectable slowdowns,
    // but we can be more precise if we need to be.
    if (pSideEffect)
    {
        *pSideEffect = FALSE;
    }

    unsigned int argCount = 1;
    if (pnode != nullptr)
    {
        while (pnode->nop == knopList)
        {
            argCount++;
            if (pSideEffect && !(ParseNode::Grfnop(pnode->AsParseNodeBin()->pnode1->nop) & fnopLeaf))
            {
                *pSideEffect = TRUE;
            }
            pnode = pnode->AsParseNodeBin()->pnode2;
        }
        argCount++;
        if (pSideEffect && !(ParseNode::Grfnop(pnode->nop) & fnopLeaf))
        {
            *pSideEffect = TRUE;
        }
    }

    AssertOrFailFastMsg(argCount < Js::Constants::UShortMaxValue, "Number of allowed arguments are already capped at parser level");

    return argCount;
}